

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf2c.cpp
# Opt level: O0

void PrintUsage(string *filename)

{
  ostream *poVar1;
  string *filename_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,(string *)filename);
  poVar1 = std::operator<<(poVar1," [inputfile]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintUsage(std::string const & filename) {
    std::cout << "Usage: " << filename << " [inputfile]" << std::endl;
}